

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.h
# Opt level: O0

qpXmlAttribute * qpSetIntAttrib(qpXmlAttribute *__return_storage_ptr__,char *name,int value)

{
  int value_local;
  char *name_local;
  
  __return_storage_ptr__->name = name;
  __return_storage_ptr__->type = QP_XML_ATTRIBUTE_INT;
  __return_storage_ptr__->stringValue = "<intAttrib>";
  __return_storage_ptr__->intValue = value;
  __return_storage_ptr__->boolValue = -1;
  return __return_storage_ptr__;
}

Assistant:

DE_INLINE qpXmlAttribute qpSetIntAttrib (const char* name, int value)
{
	qpXmlAttribute attrib;
	attrib.name			= name;
	attrib.type			= QP_XML_ATTRIBUTE_INT;
	attrib.stringValue	= "<intAttrib>";
	attrib.intValue		= value;
	attrib.boolValue	= (deBool)0xFFFFFFFFu;
	return attrib;
}